

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void moveto_snode_root(lyxp_set *set,lys_node *cur_node,int options)

{
  LY_ERR *pLVar1;
  lyxp_node_type local_2c;
  lys_node *plStack_28;
  lyxp_node_type root_type;
  lys_node *root;
  lys_node *plStack_18;
  int options_local;
  lys_node *cur_node_local;
  lyxp_set *set_local;
  
  if (set != (lyxp_set *)0x0) {
    root._4_4_ = options;
    plStack_18 = cur_node;
    cur_node_local = (lys_node *)set;
    if (cur_node == (lys_node *)0x0) {
      pLVar1 = ly_errno_location();
      *pLVar1 = LY_EINT;
      ly_log(LY_LLERR,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c",
             0x10cd);
    }
    else {
      plStack_28 = moveto_snode_get_root(cur_node,options,&local_2c);
      set_snode_clear_ctx((lyxp_set *)cur_node_local);
      set_snode_insert_node((lyxp_set *)cur_node_local,plStack_28,local_2c);
    }
  }
  return;
}

Assistant:

static void
moveto_snode_root(struct lyxp_set *set, struct lys_node *cur_node, int options)
{
    const struct lys_node *root;
    enum lyxp_node_type root_type;

    if (!set) {
        return;
    }

    if (!cur_node) {
        LOGINT;
        return;
    }

    root = moveto_snode_get_root(cur_node, options, &root_type);
    set_snode_clear_ctx(set);
    set_snode_insert_node(set, root, root_type);
}